

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

PortConnectionSyntax * __thiscall slang::parsing::Parser::parsePortConnection(Parser *this)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token placeholder;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  Token star;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_02;
  Token dot_00;
  Token name_00;
  Token dot_01;
  Token openParen_00;
  Token closeParen_00;
  bool bVar1;
  Info *in_RDI;
  Token TVar2;
  Token closeParen;
  Token openParen;
  PropertyExprSyntax *expr;
  Token name;
  Token dot;
  AttrList attributes;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffd88;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffd98;
  TokenKind in_stack_fffffffffffffd9e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  ParserBase *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  Info *pIVar3;
  undefined8 in_stack_fffffffffffffdd0;
  ParserBase *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  Info *in_stack_fffffffffffffdf0;
  TokenKind in_stack_fffffffffffffe1e;
  ParserBase *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe9c;
  Parser *in_stack_fffffffffffffea0;
  SyntaxFactory *local_150;
  Info *local_148;
  SyntaxFactory *local_130;
  Info *local_128;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_110;
  Parser *in_stack_ffffffffffffffc0;
  NamedPortConnectionSyntax *local_10;
  
  parseAttributes(in_stack_ffffffffffffffc0);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                           in_stack_fffffffffffffd9e);
  if ((bVar1) ||
     (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                               in_stack_fffffffffffffd9e), bVar1)) {
    elements._M_ptr._6_2_ = in_stack_fffffffffffffd9e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffd98;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffda0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (in_stack_fffffffffffffd90,elements);
    ParserBase::placeholderToken(in_stack_fffffffffffffde0);
    placeholder.rawLen._2_2_ = in_stack_fffffffffffffd9e;
    placeholder._0_6_ = in_stack_fffffffffffffd98;
    placeholder.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
    local_10 = (NamedPortConnectionSyntax *)
               slang::syntax::SyntaxFactory::emptyPortConnection
                         ((SyntaxFactory *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                          placeholder);
  }
  else {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                             in_stack_fffffffffffffd9e);
    if (bVar1) {
      ParserBase::consume(in_stack_fffffffffffffdb0);
      bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                               in_stack_fffffffffffffd9e);
      if (bVar1) {
        elements_00._M_ptr._6_2_ = in_stack_fffffffffffffd9e;
        elements_00._M_ptr._0_6_ = in_stack_fffffffffffffd98;
        elements_00._M_extent._M_extent_value = in_stack_fffffffffffffda0._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (in_stack_fffffffffffffd90,elements_00);
        ParserBase::consume(in_stack_fffffffffffffdb0);
        dot_00.info = (Info *)in_stack_fffffffffffffdb0;
        dot_00.kind = (short)in_stack_fffffffffffffda8;
        dot_00._2_1_ = (char)((ulong)in_stack_fffffffffffffda8 >> 0x10);
        dot_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffda8 >> 0x18);
        dot_00.rawLen = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
        star.rawLen._2_2_ = in_stack_fffffffffffffd9e;
        star._0_6_ = in_stack_fffffffffffffd98;
        star.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
        local_10 = (NamedPortConnectionSyntax *)
                   slang::syntax::SyntaxFactory::wildcardPortConnection
                             ((SyntaxFactory *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                              dot_00,star);
      }
      else {
        ParserBase::expect(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e);
        local_110 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0;
        Token::Token((Token *)in_stack_fffffffffffffd90);
        Token::Token((Token *)in_stack_fffffffffffffd90);
        bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                                 in_stack_fffffffffffffd9e);
        if (bVar1) {
          ParserBase::consume(in_stack_fffffffffffffdb0);
          bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                                   in_stack_fffffffffffffd9e);
          if (!bVar1) {
            local_110 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                        parsePropertyExpr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          }
          TVar2 = ParserBase::expect(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e);
          local_150 = TVar2._0_8_;
          local_130 = local_150;
          local_148 = TVar2.info;
          local_128 = local_148;
        }
        pIVar3 = in_RDI + 0xe;
        elements_01._M_ptr._6_2_ = in_stack_fffffffffffffd9e;
        elements_01._M_ptr._0_6_ = in_stack_fffffffffffffd98;
        elements_01._M_extent._M_extent_value = in_stack_fffffffffffffda0._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (in_stack_fffffffffffffd90,elements_01);
        dot_01.info = pIVar3;
        dot_01.kind = (short)in_stack_fffffffffffffdb8;
        dot_01._2_1_ = (char)((ulong)in_stack_fffffffffffffdb8 >> 0x10);
        dot_01.numFlags.raw = (char)((ulong)in_stack_fffffffffffffdb8 >> 0x18);
        dot_01.rawLen = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
        name_00.info = (Info *)in_stack_fffffffffffffdb0;
        name_00._0_8_ = local_128;
        openParen_00.info = in_RDI;
        openParen_00.kind = (short)in_stack_fffffffffffffdd0;
        openParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffdd0 >> 0x10);
        openParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffdd0 >> 0x18);
        openParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
        closeParen_00.info = in_stack_fffffffffffffdf0;
        closeParen_00.kind = (short)in_stack_fffffffffffffde8;
        closeParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffde8 >> 0x10);
        closeParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffde8 >> 0x18);
        closeParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
        local_10 = slang::syntax::SyntaxFactory::namedPortConnection
                             (local_130,local_110,dot_01,name_00,openParen_00,
                              (PropertyExprSyntax *)in_stack_fffffffffffffde0,closeParen_00);
      }
    }
    else {
      elements_02._M_ptr._6_2_ = in_stack_fffffffffffffd9e;
      elements_02._M_ptr._0_6_ = in_stack_fffffffffffffd98;
      elements_02._M_extent._M_extent_value = in_stack_fffffffffffffda0._M_extent_value;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (in_stack_fffffffffffffd90,elements_02);
      parsePropertyExpr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      local_10 = (NamedPortConnectionSyntax *)
                 slang::syntax::SyntaxFactory::orderedPortConnection
                           ((SyntaxFactory *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                            (PropertyExprSyntax *)0xbe0fd3);
    }
  }
  return &local_10->super_PortConnectionSyntax;
}

Assistant:

PortConnectionSyntax& Parser::parsePortConnection() {
    auto attributes = parseAttributes();

    // Allow for empty port connections.
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyPortConnection(attributes, placeholderToken());

    if (peek(TokenKind::Dot)) {
        auto dot = consume();

        if (peek(TokenKind::Star))
            return factory.wildcardPortConnection(attributes, dot, consume());

        auto name = expect(TokenKind::Identifier);

        PropertyExprSyntax* expr = nullptr;
        Token openParen, closeParen;

        if (peek(TokenKind::OpenParenthesis)) {
            openParen = consume();
            if (!peek(TokenKind::CloseParenthesis))
                expr = &parsePropertyExpr(0);

            closeParen = expect(TokenKind::CloseParenthesis);
        }
        return factory.namedPortConnection(attributes, dot, name, openParen, expr, closeParen);
    }
    return factory.orderedPortConnection(attributes, parsePropertyExpr(0));
}